

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_ObjHasCutWithSize(Jf_Cut_t **pSto,int c,int nSize)

{
  int local_24;
  int i;
  int nSize_local;
  int c_local;
  Jf_Cut_t **pSto_local;
  
  local_24 = 0;
  while( true ) {
    if (c <= local_24) {
      return 0;
    }
    if (pSto[local_24]->pCut[0] <= nSize) break;
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

static inline int Jf_ObjHasCutWithSize( Jf_Cut_t ** pSto, int c, int nSize )
{
    int i;
    for ( i = 0; i < c; i++ )
        if ( pSto[i]->pCut[0] <= nSize )
            return 1;
    return 0;
}